

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Exporter::ExportMeshes(glTF2Exporter *this)

{
  value_type vVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  element_type *peVar8;
  char *pcVar9;
  Skin *pSVar10;
  Mesh *pMVar11;
  reference pvVar12;
  reference pvVar13;
  size_type sVar14;
  ulong uVar15;
  void *data;
  reference v_00;
  Node *pNVar16;
  Ref<glTF2::Buffer> RVar17;
  Ref<glTF2::Skin> RVar18;
  Ref<glTF2::Mesh> RVar19;
  Ref<glTF2::Material> RVar20;
  Ref<glTF2::Accessor> RVar21;
  Ref<glTF2::Node> RVar22;
  undefined1 local_400 [8];
  Ref<glTF2::Node> rootJoint;
  string local_3d0 [8];
  string meshID;
  uint i_3;
  bool hasBones;
  undefined1 local_398 [8];
  Ref<glTF2::Mesh> mesh;
  undefined1 local_380 [4];
  uint meshIndex;
  Ref<glTF2::Node> meshNode;
  undefined1 local_360 [8];
  Ref<glTF2::Node> rootNode;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *local_340;
  Ref<glTF2::Accessor> invBindMatrixAccessor;
  uint idx_joint;
  mat4 *invBindMatrixData;
  ulong local_300;
  size_t j_1;
  size_t i_2;
  undefined1 local_2e8 [4];
  uint nIndicesPerFace;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  undefined1 local_2c0 [8];
  Ref<glTF2::Accessor> c;
  uint indexColorChannel;
  undefined1 local_298 [8];
  Ref<glTF2::Accessor> tc;
  uint local_280;
  Value type;
  uint j;
  int i_1;
  undefined1 local_268 [8];
  Ref<glTF2::Accessor> n;
  uint i;
  undefined1 local_240 [8];
  Ref<glTF2::Accessor> v;
  Primitive *p;
  undefined1 local_1f8 [8];
  Ref<glTF2::Mesh> m;
  string meshId;
  undefined1 local_1c0 [8];
  string name;
  aiMesh *aim_1;
  uint idx_mesh_1;
  undefined1 local_170 [8];
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  string local_150;
  undefined1 local_130 [8];
  string skinName;
  Ref<glTF2::Skin> skinRef;
  aiMesh *aim;
  uint idx_mesh;
  bool createSkin;
  undefined1 local_c0 [8];
  Ref<glTF2::Buffer> b;
  string local_a8;
  undefined1 local_88 [8];
  string bufferId;
  string bufferIdPrefix;
  allocator<char> local_31;
  string local_30 [8];
  string fname;
  glTF2Exporter *this_local;
  
  pcVar9 = this->mFilename;
  fname.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,pcVar9,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::rfind((char *)local_30,0xba3d3c);
  std::__cxx11::string::substr((ulong)((long)&bufferId.field_2 + 8),(ulong)local_30);
  peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"",(allocator<char> *)&b.field_0xf);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  glTF2::Asset::FindUniqueID((string *)local_88,peVar8,&local_a8,pcVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&b.field_0xf);
  peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  RVar17 = glTF2::Asset::GetBodyBuffer(peVar8);
  local_c0 = (undefined1  [8])RVar17.vector;
  b.vector._0_4_ = RVar17.index;
  bVar5 = glTF2::Ref::operator_cast_to_bool((Ref *)local_c0);
  if (!bVar5) {
    peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar17 = glTF2::LazyDict<glTF2::Buffer>::Create(&peVar8->buffers,(string *)local_88);
    local_c0 = (undefined1  [8])RVar17.vector;
    b.vector._0_4_ = RVar17.index;
  }
  bVar5 = false;
  aim._0_4_ = 0;
  do {
    if (this->mScene->mNumMeshes <= (uint)aim) {
LAB_005300aa:
      glTF2::Ref<glTF2::Skin>::Ref((Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8));
      peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"skin",
                 (allocator<char> *)
                 ((long)&inverseBindMatricesData.
                         super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      glTF2::Asset::FindUniqueID((string *)local_130,peVar8,&local_150,"skin");
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&inverseBindMatricesData.
                         super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::vector
                ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_170);
      if (bVar5) {
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar18 = glTF2::LazyDict<glTF2::Skin>::Create(&peVar8->skins,(string *)local_130);
        skinName.field_2._8_8_ = RVar18.vector;
        skinRef.vector._0_4_ = RVar18.index;
        pSVar10 = glTF2::Ref<glTF2::Skin>::operator->
                            ((Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8));
        std::__cxx11::string::operator=((string *)&pSVar10->name,(string *)local_130);
      }
      for (aim_1._4_4_ = 0; aim_1._4_4_ < this->mScene->mNumMeshes; aim_1._4_4_ = aim_1._4_4_ + 1) {
        name.field_2._8_8_ = this->mScene->mMeshes[aim_1._4_4_];
        pcVar9 = aiString::C_Str(&((aiMesh *)name.field_2._8_8_)->mName);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c0,pcVar9,(allocator<char> *)(meshId.field_2._M_local_buf + 0xf)
                  );
        std::allocator<char>::~allocator((allocator<char> *)(meshId.field_2._M_local_buf + 0xf));
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        glTF2::Asset::FindUniqueID((string *)&m.index,peVar8,(string *)local_1c0,"mesh");
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar19 = glTF2::LazyDict<glTF2::Mesh>::Create(&peVar8->meshes,(string *)&m.index);
        local_1f8 = (undefined1  [8])RVar19.vector;
        m.vector._0_4_ = RVar19.index;
        pMVar11 = glTF2::Ref<glTF2::Mesh>::operator->((Ref<glTF2::Mesh> *)local_1f8);
        std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::resize
                  (&pMVar11->primitives,1);
        pMVar11 = glTF2::Ref<glTF2::Mesh>::operator->((Ref<glTF2::Mesh> *)local_1f8);
        pvVar12 = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::back
                            (&pMVar11->primitives);
        pMVar11 = glTF2::Ref<glTF2::Mesh>::operator->((Ref<glTF2::Mesh> *)local_1f8);
        std::__cxx11::string::operator=((string *)&(pMVar11->super_Object).name,(string *)local_1c0)
        ;
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar20 = glTF2::LazyDict<glTF2::Material>::Get
                           (&peVar8->materials,*(uint *)(name.field_2._8_8_ + 0xe8));
        v._8_8_ = RVar20.vector;
        (pvVar12->material).index = RVar20.index;
        (pvVar12->material).vector =
             (vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> *)v._8_8_;
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mAsset);
        RVar21 = ExportData(peVar8,(string *)&m.index,(Ref<glTF2::Buffer> *)local_c0,
                            (ulong)*(uint *)(name.field_2._8_8_ + 4),
                            *(void **)(name.field_2._8_8_ + 0x10),VEC3,VEC3,ComponentType_FLOAT,
                            false);
        local_240 = (undefined1  [8])RVar21.vector;
        v.vector._0_4_ = RVar21.index;
        bVar6 = glTF2::Ref::operator_cast_to_bool((Ref *)local_240);
        if (bVar6) {
          std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
          push_back(&(pvVar12->attributes).position,(value_type *)local_240);
        }
        if (*(long *)(name.field_2._8_8_ + 0x18) != 0) {
          for (n._12_4_ = 0; (uint)n._12_4_ < *(uint *)(name.field_2._8_8_ + 4);
              n._12_4_ = n._12_4_ + 1) {
            aiVector3t<float>::Normalize
                      ((aiVector3t<float> *)
                       (*(long *)(name.field_2._8_8_ + 0x18) + (ulong)(uint)n._12_4_ * 0xc));
          }
        }
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mAsset);
        RVar21 = ExportData(peVar8,(string *)&m.index,(Ref<glTF2::Buffer> *)local_c0,
                            (ulong)*(uint *)(name.field_2._8_8_ + 4),
                            *(void **)(name.field_2._8_8_ + 0x18),VEC3,VEC3,ComponentType_FLOAT,
                            false);
        local_268 = (undefined1  [8])RVar21.vector;
        n.vector._0_4_ = RVar21.index;
        bVar6 = glTF2::Ref::operator_cast_to_bool((Ref *)local_268);
        if (bVar6) {
          std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
          push_back(&(pvVar12->attributes).normal,(value_type *)local_268);
        }
        for (type = SCALAR; (int)type < 8; type = type + VEC2) {
          bVar6 = aiMesh::HasTextureCoords((aiMesh *)name.field_2._8_8_,type);
          if (bVar6) {
            if (1 < *(uint *)(name.field_2._8_8_ + 0xb0 + (long)(int)type * 4)) {
              for (local_280 = 0; local_280 < *(uint *)(name.field_2._8_8_ + 4);
                  local_280 = local_280 + 1) {
                *(float *)(*(long *)(name.field_2._8_8_ + 0x70 + (long)(int)type * 8) +
                           (ulong)local_280 * 0xc + 4) =
                     1.0 - *(float *)(*(long *)(name.field_2._8_8_ + 0x70 + (long)(int)type * 8) +
                                      (ulong)local_280 * 0xc + 4);
              }
            }
            if (*(int *)(name.field_2._8_8_ + 0xb0 + (long)(int)type * 4) != 0) {
              tc._12_4_ = (*(int *)(name.field_2._8_8_ + 0xb0 + (long)(int)type * 4) != 2) + 1;
              peVar8 = std::
                       __shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
              RVar21 = ExportData(peVar8,(string *)&m.index,(Ref<glTF2::Buffer> *)local_c0,
                                  (ulong)*(uint *)(name.field_2._8_8_ + 4),
                                  *(void **)(name.field_2._8_8_ + 0x70 + (long)(int)type * 8),VEC3,
                                  tc._12_4_,ComponentType_FLOAT,false);
              local_298 = (undefined1  [8])RVar21.vector;
              tc.vector._0_4_ = RVar21.index;
              bVar6 = glTF2::Ref::operator_cast_to_bool((Ref *)local_298);
              if (bVar6) {
                std::
                vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
                push_back(&(pvVar12->attributes).texcoord,(value_type *)local_298);
              }
            }
          }
        }
        for (c._12_4_ = 0; uVar4 = c._12_4_,
            uVar7 = aiMesh::GetNumColorChannels((aiMesh *)name.field_2._8_8_), (uint)uVar4 < uVar7;
            c._12_4_ = c._12_4_ + 1) {
          peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->mAsset);
          RVar21 = ExportData(peVar8,(string *)&m.index,(Ref<glTF2::Buffer> *)local_c0,
                              (ulong)*(uint *)(name.field_2._8_8_ + 4),
                              *(void **)(name.field_2._8_8_ + 0x30 + (ulong)(uint)c._12_4_ * 8),VEC4
                              ,VEC4,ComponentType_FLOAT,false);
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)RVar21.vector;
          c.vector._0_4_ = RVar21.index;
          local_2c0 = (undefined1  [8])
                      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          bVar6 = glTF2::Ref::operator_cast_to_bool((Ref *)local_2c0);
          if (bVar6) {
            std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
            ::push_back(&(pvVar12->attributes).color,(value_type *)local_2c0);
          }
        }
        if (*(int *)(name.field_2._8_8_ + 8) != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8);
          uVar7 = **(uint **)(name.field_2._8_8_ + 0xd0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8,
                     (ulong)(*(int *)(name.field_2._8_8_ + 8) * uVar7));
          for (j_1 = 0; j_1 < *(uint *)(name.field_2._8_8_ + 8); j_1 = j_1 + 1) {
            for (local_300 = 0; local_300 < uVar7; local_300 = local_300 + 1) {
              vVar1 = *(value_type *)
                       (*(long *)(*(long *)(name.field_2._8_8_ + 0xd0) + j_1 * 0x10 + 8) +
                       local_300 * 4);
              pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8,
                                   j_1 * uVar7 + local_300);
              *pvVar13 = vVar1;
            }
          }
          peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->mAsset);
          sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8,0);
          RVar21 = ExportData(peVar8,(string *)&m.index,(Ref<glTF2::Buffer> *)local_c0,sVar14,
                              pvVar13,SCALAR,SCALAR,ComponentType_UNSIGNED_INT,true);
          (pvVar12->indices).vector = RVar21.vector;
          (pvVar12->indices).index = RVar21.index;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8);
        }
        iVar2 = *(int *)name.field_2._8_8_;
        if (iVar2 == 1) {
          pvVar12->mode = PrimitiveMode_POINTS;
        }
        else if (iVar2 == 2) {
          pvVar12->mode = PrimitiveMode_LINES;
        }
        else if (iVar2 == 8) {
          pvVar12->mode = PrimitiveMode_TRIANGLES;
        }
        else {
          pvVar12->mode = PrimitiveMode_TRIANGLES;
        }
        bVar6 = aiMesh::HasBones((aiMesh *)name.field_2._8_8_);
        if (bVar6) {
          peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->mAsset);
          ExportSkin(peVar8,(aiMesh *)name.field_2._8_8_,(Ref<glTF2::Mesh> *)local_1f8,
                     (Ref<glTF2::Buffer> *)local_c0,
                     (Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8),
                     (vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_170
                    );
        }
        std::__cxx11::string::~string((string *)&m.index);
        std::__cxx11::string::~string((string *)local_1c0);
      }
      if (bVar5) {
        sVar14 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            local_170);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = sVar14;
        uVar15 = SUB168(auVar3 * ZEXT816(0x40),0);
        if (SUB168(auVar3 * ZEXT816(0x40),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        data = operator_new__(uVar15);
        for (invBindMatrixAccessor._12_4_ = 0; uVar15 = (ulong)(uint)invBindMatrixAccessor._12_4_,
            sVar14 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                               ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                 *)local_170), uVar15 < sVar14;
            invBindMatrixAccessor._12_4_ = invBindMatrixAccessor._12_4_ + 1) {
          v_00 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::operator[]
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            local_170,(ulong)(uint)invBindMatrixAccessor._12_4_);
          CopyValue(v_00,(mat4 *)((long)data + (ulong)(uint)invBindMatrixAccessor._12_4_ * 0x40));
        }
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mAsset);
        sVar14 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            local_170);
        RVar21 = ExportData(peVar8,(string *)local_130,(Ref<glTF2::Buffer> *)local_c0,
                            sVar14 & 0xffffffff,data,MAT4,MAT4,ComponentType_FLOAT,false);
        rootNode._8_8_ = RVar21.vector;
        invBindMatrixAccessor.vector._0_4_ = RVar21.index;
        local_340 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)rootNode._8_8_;
        bVar5 = glTF2::Ref::operator_cast_to_bool((Ref *)&local_340);
        if (bVar5) {
          pSVar10 = glTF2::Ref<glTF2::Skin>::operator->
                              ((Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8));
          (pSVar10->inverseBindMatrices).vector = local_340;
          (pSVar10->inverseBindMatrices).index = (uint)invBindMatrixAccessor.vector;
        }
        pSVar10 = glTF2::Ref<glTF2::Skin>::operator->
                            ((Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8));
        (pSVar10->bindShapeMatrix).isPresent = true;
        pSVar10 = glTF2::Ref<glTF2::Skin>::operator->
                            ((Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8));
        IdentityMatrix4((pSVar10->bindShapeMatrix).value);
        peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar22 = glTF2::LazyDict<glTF2::Node>::Get(&peVar8->nodes,0);
        meshNode._8_8_ = RVar22.vector;
        rootNode.vector._0_4_ = RVar22.index;
        local_360 = (undefined1  [8])meshNode._8_8_;
        glTF2::Ref<glTF2::Node>::Ref((Ref<glTF2::Node> *)local_380);
        mesh._12_4_ = 0;
        while( true ) {
          uVar4 = mesh._12_4_;
          peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mAsset);
          uVar7 = glTF2::LazyDict<glTF2::Mesh>::Size(&peVar8->meshes);
          if (uVar7 <= (uint)uVar4) break;
          peVar8 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mAsset);
          RVar19 = glTF2::LazyDict<glTF2::Mesh>::Get(&peVar8->meshes,mesh._12_4_);
          local_398 = (undefined1  [8])RVar19.vector;
          mesh.vector._0_4_ = RVar19.index;
          meshID.field_2._M_local_buf[0xf] = '\0';
          meshID.field_2._8_4_ = 0;
          while( true ) {
            uVar15 = (ulong)(uint)meshID.field_2._8_4_;
            pMVar11 = glTF2::Ref<glTF2::Mesh>::operator->((Ref<glTF2::Mesh> *)local_398);
            sVar14 = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::
                     size(&pMVar11->primitives);
            if (sVar14 <= uVar15) break;
            pMVar11 = glTF2::Ref<glTF2::Mesh>::operator->((Ref<glTF2::Mesh> *)local_398);
            pvVar12 = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::
                      operator[](&pMVar11->primitives,(ulong)(uint)meshID.field_2._8_4_);
            bVar5 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::empty(&(pvVar12->attributes).weight);
            if (!bVar5) {
              meshID.field_2._M_local_buf[0xf] = '\x01';
              break;
            }
            meshID.field_2._8_4_ = meshID.field_2._8_4_ + 1;
          }
          if ((meshID.field_2._M_local_buf[0xf] & 1U) != 0) {
            pMVar11 = glTF2::Ref<glTF2::Mesh>::operator->((Ref<glTF2::Mesh> *)local_398);
            std::__cxx11::string::string(local_3d0,(string *)&(pMVar11->super_Object).id);
            std::__cxx11::string::string((string *)&rootJoint.index,local_3d0);
            FindMeshNode((Ref<glTF2::Node> *)local_360,(Ref<glTF2::Node> *)local_380,
                         (string *)&rootJoint.index);
            std::__cxx11::string::~string((string *)&rootJoint.index);
            RVar22 = FindSkeletonRootJoint((Ref<glTF2::Skin> *)((long)&skinName.field_2 + 8));
            local_400 = (undefined1  [8])RVar22.vector;
            rootJoint.vector._0_4_ = RVar22.index;
            pNVar16 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_380);
            std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
            push_back(&pNVar16->skeletons,(value_type *)local_400);
            pNVar16 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_380);
            (pNVar16->skin).vector =
                 (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)skinName.field_2._8_8_;
            (pNVar16->skin).index = (uint)skinRef.vector;
            std::__cxx11::string::~string(local_3d0);
          }
          mesh._12_4_ = mesh._12_4_ + 1;
        }
        if (data != (void *)0x0) {
          operator_delete__(data);
        }
      }
      std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~vector
                ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_170);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(bufferId.field_2._M_local_buf + 8));
      std::__cxx11::string::~string(local_30);
      return;
    }
    bVar6 = aiMesh::HasBones(this->mScene->mMeshes[(uint)aim]);
    if (bVar6) {
      bVar5 = true;
      goto LAB_005300aa;
    }
    aim._0_4_ = (uint)aim + 1;
  } while( true );
}

Assistant:

void glTF2Exporter::ExportMeshes()
{
    typedef decltype(aiFace::mNumIndices) IndicesType;

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

        std::string name = aim->mName.C_Str();

        std::string meshId = mAsset->FindUniqueID(name, "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        m->name = name;

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
        // Normalize all normals as the validator can emit a warning otherwise
        if ( nullptr != aim->mNormals) {
            for ( auto i = 0u; i < aim->mNumVertices; ++i ) {
                aim->mNormals[ i ].Normalize();
            }
        }

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
			if (!aim->HasTextureCoords(i))
				continue;
			
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertex colors ****************/
		for (unsigned int indexColorChannel = 0; indexColorChannel < aim->GetNumColorChannels(); ++indexColorChannel) {
			Ref<Accessor> c = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mColors[indexColorChannel], AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT, false);
			if (c)
				p.attributes.color.push_back(c);
		}

		/*************** Vertices indices ****************/
		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = IndicesType(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, indices.size(), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_INT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

        /*************** Skins ****************/
        if(aim->HasBones()) {
            ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
        }
    }

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b,
                static_cast<unsigned int>(inverseBindMatricesData.size()),
            invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) {
            skinRef->inverseBindMatrices = invBindMatrixAccessor;
        }

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find nodes that contain a mesh with bones and add "skeletons" and "skin" attributes to those nodes.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        for (unsigned int meshIndex = 0; meshIndex < mAsset->meshes.Size(); ++meshIndex) {
            Ref<Mesh> mesh = mAsset->meshes.Get(meshIndex);
            bool hasBones = false;
            for (unsigned int i = 0; i < mesh->primitives.size(); ++i) {
                if (!mesh->primitives[i].attributes.weight.empty()) {
                    hasBones = true;
                    break;
                }
            }
            if (!hasBones) {
                continue;
            }
            std::string meshID = mesh->id;
            FindMeshNode(rootNode, meshNode, meshID);
            Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
            meshNode->skeletons.push_back(rootJoint);
            meshNode->skin = skinRef;
        }
        delete[] invBindMatrixData;
    }
}